

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnMemoryFillExpr(Validator *this,MemoryFillExpr *expr)

{
  Var local_70;
  Enum local_24;
  MemoryFillExpr *local_20;
  MemoryFillExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (MemoryFillExpr *)this;
  Var::Var(&local_70,&expr->memidx);
  local_24 = (Enum)SharedValidator::OnMemoryFill
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)30>).super_Expr.loc,&local_70)
  ;
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnMemoryFillExpr(MemoryFillExpr* expr) {
  result_ |= validator_.OnMemoryFill(expr->loc, expr->memidx);
  return Result::Ok;
}